

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O3

bool __thiscall
cmBuildCommand::MainSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  int iVar5;
  char *__s;
  cmGlobalGenerator *this_00;
  size_t sVar6;
  ostream *poVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  pointer pbVar11;
  ulong uVar12;
  string target;
  string makecommand;
  string local_218;
  char *local_1f8;
  string local_1f0;
  pointer local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar11) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"requires at least one argument naming a CMake variable","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  local_1d0 = (pbVar11->_M_dataplus)._M_p;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  iVar10 = 0;
  if ((ulong)((long)pbVar2 - (long)pbVar11) < 0x21) {
    pcVar9 = (char *)0x0;
  }
  else {
    local_1f8 = (char *)0x0;
    __s = (char *)0x0;
    uVar8 = 1;
    uVar12 = 2;
    do {
      iVar5 = std::__cxx11::string::compare((char *)(pbVar11 + uVar8));
      if (iVar5 == 0) {
        iVar10 = 1;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar8));
        if (iVar5 == 0) {
          iVar10 = 2;
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar8));
          if (iVar5 == 0) {
            iVar10 = 3;
          }
          else if (iVar10 == 3) {
            iVar10 = 0;
            std::__cxx11::string::_M_assign((string *)&local_1f0);
          }
          else {
            if (iVar10 == 2) {
              local_1f8 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
            }
            else {
              if (iVar10 != 1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"unknown argument \"",0x12);
                pbVar11 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,pbVar11[uVar8]._M_dataplus._M_p,
                                    pbVar11[uVar8]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_218);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                bVar4 = false;
                goto LAB_0039b8d2;
              }
              __s = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
            }
            iVar10 = 0;
          }
        }
      }
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar12 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >>
                              5);
      uVar8 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar4);
    pcVar9 = local_1f8;
    if ((__s != (char *)0x0) && (*__s != '\0')) goto LAB_0039b75c;
  }
  __s = getenv("CMAKE_CONFIG_TYPE");
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    __s = "Release";
  }
LAB_0039b75c:
  if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
    pcVar3 = (this->super_cmCommand).Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Ignoring PROJECT_NAME option because it has no effect.","");
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_1a8,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
  paVar1 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  sVar6 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,__s,__s + sVar6);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  bVar4 = cmMakefile::IgnoreErrorsCMP0061((this->super_cmCommand).Makefile);
  cmGlobalGenerator::GenerateCMakeBuildCommand
            ((string *)local_1a8,this_00,&local_1f0,&local_218,&local_1c8,bVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&local_218,local_1d0,(allocator *)&local_1c8);
  cmMakefile::AddDefinition(pcVar3,&local_218,(char *)local_1a8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar4 = true;
LAB_0039b8d2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool cmBuildCommand
::MainSignature(std::vector<std::string> const& args)
{
  if(args.size() < 1)
    {
    this->SetError("requires at least one argument naming a CMake variable");
    return false;
    }

  // The cmake variable in which to store the result.
  const char* variable = args[0].c_str();

  // Parse remaining arguments.
  const char* configuration = 0;
  const char* project_name = 0;
  std::string target;
  enum Doing { DoingNone, DoingConfiguration, DoingProjectName, DoingTarget };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "CONFIGURATION")
      {
      doing = DoingConfiguration;
      }
    else if(args[i] == "PROJECT_NAME")
      {
      doing = DoingProjectName;
      }
    else if(args[i] == "TARGET")
      {
      doing = DoingTarget;
      }
    else if(doing == DoingConfiguration)
      {
      doing = DoingNone;
      configuration = args[i].c_str();
      }
    else if(doing == DoingProjectName)
      {
      doing = DoingNone;
      project_name = args[i].c_str();
      }
    else if(doing == DoingTarget)
      {
      doing = DoingNone;
      target = args[i];
      }
    else
      {
      std::ostringstream e;
      e << "unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
      }
    }

  // If null/empty CONFIGURATION argument, cmake --build uses 'Debug'
  // in the currently implemented multi-configuration global generators...
  // so we put this code here to end up with the same default configuration
  // as the original 2-arg build_command signature:
  //
  if(!configuration || !*configuration)
    {
    configuration = getenv("CMAKE_CONFIG_TYPE");
    }
  if(!configuration || !*configuration)
    {
    configuration = "Release";
    }

  if(project_name && *project_name)
    {
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
      "Ignoring PROJECT_NAME option because it has no effect.");
    }

  std::string makecommand = this->Makefile->GetGlobalGenerator()
    ->GenerateCMakeBuildCommand(target, configuration, "",
                                this->Makefile->IgnoreErrorsCMP0061());

  this->Makefile->AddDefinition(variable, makecommand.c_str());

  return true;
}